

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPFakeTransmitter::GetLocalHostName
          (RTPFakeTransmitter *this,uint8_t *buffer,size_t *bufferlength)

{
  uint uVar1;
  ulong __n;
  _List_node_base *p_Var2;
  bool bVar3;
  int iVar4;
  hostent *phVar5;
  long lVar6;
  uint8_t *puVar7;
  size_t sVar8;
  _Self __tmp;
  _List_node_base *p_Var9;
  const_iterator it;
  allocator<char> local_85;
  uint8_t addr [4];
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  hostnames;
  string hname;
  
  if (this->init != true) {
    return -0x84;
  }
  if (this->created != true) {
    return -0x83;
  }
  if (this->localhostname != (uint8_t *)0x0) goto LAB_0013baae;
  p_Var9 = (this->localIPs).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  if (p_Var9 == (_List_node_base *)&this->localIPs) {
    return -0x7f;
  }
  hostnames.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&hostnames;
  hostnames.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  hostnames.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       hostnames.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  for (; p_Var9 != (_List_node_base *)&this->localIPs; p_Var9 = p_Var9->_M_next) {
    uVar1 = *(uint *)&p_Var9[1]._M_next;
    addr = (uint8_t  [4])
           (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18);
    phVar5 = gethostbyaddr(addr,4,2);
    if (phVar5 != (hostent *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&hname,phVar5->h_name,&local_85);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&hostnames,&hname);
      std::__cxx11::string::~string((string *)&hname);
    }
  }
  if (hostnames.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&hostnames) {
LAB_0013bbfc:
    uVar1 = *(uint *)&(this->localIPs).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>
                      ._M_impl._M_node.super__List_node_base._M_next[1]._M_next;
    snprintf((char *)&hname,0x10,"%d.%d.%d.%d",(ulong)(uVar1 >> 0x18),(ulong)(uVar1 >> 0x10 & 0xff),
             (ulong)(uVar1 >> 8 & 0xff),uVar1 & 0xff);
    sVar8 = strlen((char *)&hname);
    this->localhostnamelength = (long)(int)sVar8;
    puVar7 = (uint8_t *)
             operator_new__((long)(int)sVar8 + 1,
                            (this->super_RTPTransmitter).super_RTPMemoryObject.mgr,0);
    this->localhostname = puVar7;
    if (puVar7 == (uint8_t *)0x0) {
LAB_0013bc9b:
      std::__cxx11::
      _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_clear(&hostnames.
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                );
      return -1;
    }
    memcpy(puVar7,&hname,this->localhostnamelength);
    this->localhostname[this->localhostnamelength] = '\0';
  }
  else {
    bVar3 = false;
    for (p_Var9 = hostnames.
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
        (!bVar3 && (p_Var9 != (_List_node_base *)&hostnames));
        p_Var9 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
      lVar6 = std::__cxx11::string::find((char)(p_Var9 + 1),0x2e);
      if (lVar6 != -1) {
        p_Var2 = p_Var9[1]._M_prev;
        this->localhostnamelength = (size_t)p_Var2;
        puVar7 = (uint8_t *)
                 operator_new__((size_t)((long)&p_Var2->_M_next + 1),
                                (this->super_RTPTransmitter).super_RTPMemoryObject.mgr,0);
        this->localhostname = puVar7;
        if (puVar7 == (uint8_t *)0x0) goto LAB_0013bc9b;
        memcpy(puVar7,p_Var9[1]._M_next,this->localhostnamelength);
        this->localhostname[this->localhostnamelength] = '\0';
        bVar3 = true;
      }
    }
    if (!bVar3) goto LAB_0013bbfc;
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&hostnames.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
LAB_0013baae:
  __n = this->localhostnamelength;
  if (*bufferlength < __n) {
    *bufferlength = __n;
    iVar4 = -0x45;
  }
  else {
    memcpy(buffer,this->localhostname,__n);
    *bufferlength = this->localhostnamelength;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int RTPFakeTransmitter::GetLocalHostName(uint8_t *buffer,size_t *bufferlength)
{
	if (!init)
		return ERR_RTP_FAKETRANS_NOTINIT;

	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_FAKETRANS_NOTCREATED;
	}

	if (localhostname == 0)
	{
		if (localIPs.empty())
		{
			MAINMUTEX_UNLOCK
			return ERR_RTP_FAKETRANS_NOLOCALIPS;
		}
		
		std::list<uint32_t>::const_iterator it;
		std::list<std::string> hostnames;
	
		for (it = localIPs.begin() ; it != localIPs.end() ; it++)
		{
			struct hostent *he;
			uint8_t addr[4];
			uint32_t ip = (*it);
	
			addr[0] = (uint8_t)((ip>>24)&0xFF);
			addr[1] = (uint8_t)((ip>>16)&0xFF);
			addr[2] = (uint8_t)((ip>>8)&0xFF);
			addr[3] = (uint8_t)(ip&0xFF);
			he = gethostbyaddr((char *)addr,4,AF_INET);
			if (he != 0)
			{
				std::string hname = std::string(he->h_name);
				hostnames.push_back(hname);
			}
		}
	
		bool found  = false;
		
		if (!hostnames.empty())	// try to select the most appropriate hostname
		{
			std::list<std::string>::const_iterator it;
			
			for (it = hostnames.begin() ; !found && it != hostnames.end() ; it++)
			{
				if ((*it).find('.') != std::string::npos)
				{
					found = true;
					localhostnamelength = (*it).length();
					localhostname = RTPNew(GetMemoryManager(),RTPMEM_TYPE_OTHER) uint8_t [localhostnamelength+1];
					if (localhostname == 0)
					{
						MAINMUTEX_UNLOCK
						return ERR_RTP_OUTOFMEM;
					}
					memcpy(localhostname,(*it).c_str(),localhostnamelength);
					localhostname[localhostnamelength] = 0;
				}
			}
		}
	
		if (!found) // use an IP address
		{
			uint32_t ip;
			int len;
			char str[16];
			
			it = localIPs.begin();
			ip = (*it);
			
			snprintf(str,16,"%d.%d.%d.%d",(int)((ip>>24)&0xFF),(int)((ip>>16)&0xFF),(int)((ip>>8)&0xFF),(int)(ip&0xFF));
			len = strlen(str);
	
			localhostnamelength = len;
			localhostname = RTPNew(GetMemoryManager(),RTPMEM_TYPE_OTHER) uint8_t [localhostnamelength + 1];
			if (localhostname == 0)
			{
				MAINMUTEX_UNLOCK
				return ERR_RTP_OUTOFMEM;
			}
			memcpy(localhostname,str,localhostnamelength);
			localhostname[localhostnamelength] = 0;
		}
	}
	
	if ((*bufferlength) < localhostnamelength)
	{
		*bufferlength = localhostnamelength; // tell the application the required size of the buffer
		MAINMUTEX_UNLOCK
		return ERR_RTP_TRANS_BUFFERLENGTHTOOSMALL;
	}

	memcpy(buffer,localhostname,localhostnamelength);
	*bufferlength = localhostnamelength;
	
	MAINMUTEX_UNLOCK
	return 0;
}